

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DB::Open(DB *this,Options *options,string *dbname,DB **dbptr)

{
  Env *pEVar1;
  bool bVar2;
  DBImpl *this_00;
  Writer *this_01;
  MemTable *this_02;
  undefined1 local_130 [56];
  WritableFile *lfile;
  uint64_t new_log_number;
  undefined1 local_e8 [7];
  bool save_manifest;
  VersionEdit edit;
  DBImpl *impl;
  DB **dbptr_local;
  string *dbname_local;
  Options *options_local;
  Status *s;
  
  *dbptr = (DB *)0x0;
  this_00 = (DBImpl *)operator_new(0x2e0);
  DBImpl::DBImpl(this_00,options,dbname);
  port::Mutex::Lock(&this_00->mutex_);
  VersionEdit::VersionEdit((VersionEdit *)local_e8);
  new_log_number._7_1_ = 0;
  new_log_number._6_1_ = 0;
  DBImpl::Recover((DBImpl *)this,(VersionEdit *)this_00,(bool *)local_e8);
  bVar2 = Status::ok((Status *)this);
  if ((bVar2) && (this_00->mem_ == (MemTable *)0x0)) {
    lfile = (WritableFile *)VersionSet::NewFileNumber(this_00->versions_);
    pEVar1 = options->env;
    LogFileName((leveldb *)(local_130 + 8),dbname,(uint64_t)lfile);
    (*pEVar1->_vptr_Env[4])(local_130 + 0x28,pEVar1,local_130 + 8,local_130 + 0x30);
    Status::operator=((Status *)this,(Status *)(local_130 + 0x28));
    Status::~Status((Status *)(local_130 + 0x28));
    std::__cxx11::string::~string((string *)(local_130 + 8));
    bVar2 = Status::ok((Status *)this);
    if (bVar2) {
      VersionEdit::SetLogNumber((VersionEdit *)local_e8,(uint64_t)lfile);
      this_00->logfile_ = (WritableFile *)local_130._48_8_;
      this_00->logfile_number_ = (uint64_t)lfile;
      this_01 = (Writer *)operator_new(0x20);
      log::Writer::Writer(this_01,(WritableFile *)local_130._48_8_);
      this_00->log_ = this_01;
      this_02 = (MemTable *)operator_new(0x70);
      MemTable::MemTable(this_02,&this_00->internal_comparator_);
      this_00->mem_ = this_02;
      MemTable::Ref(this_00->mem_);
    }
  }
  bVar2 = Status::ok((Status *)this);
  if ((bVar2) && ((new_log_number._7_1_ & 1) != 0)) {
    VersionEdit::SetPrevLogNumber((VersionEdit *)local_e8,0);
    VersionEdit::SetLogNumber((VersionEdit *)local_e8,this_00->logfile_number_);
    VersionSet::LogAndApply
              ((VersionSet *)local_130,(VersionEdit *)this_00->versions_,(Mutex *)local_e8);
    Status::operator=((Status *)this,(Status *)local_130);
    Status::~Status((Status *)local_130);
  }
  bVar2 = Status::ok((Status *)this);
  if (bVar2) {
    DBImpl::DeleteObsoleteFiles(this_00);
    DBImpl::MaybeScheduleCompaction(this_00);
  }
  port::Mutex::Unlock(&this_00->mutex_);
  bVar2 = Status::ok((Status *)this);
  if (bVar2) {
    if (this_00->mem_ == (MemTable *)0x0) {
      __assert_fail("impl->mem_ != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                    ,0x6b3,
                    "static Status leveldb::DB::Open(const Options &, const std::string &, DB **)");
    }
    *dbptr = (DB *)this_00;
  }
  else if (this_00 != (DBImpl *)0x0) {
    (*(this_00->super_DB)._vptr_DB[1])();
  }
  new_log_number._6_1_ = 1;
  VersionEdit::~VersionEdit((VersionEdit *)local_e8);
  return (Status)(char *)this;
}

Assistant:

Status DB::Open(const Options& options, const std::string& dbname, DB** dbptr) {
  *dbptr = nullptr;

  DBImpl* impl = new DBImpl(options, dbname);
  impl->mutex_.Lock();
  VersionEdit edit;
  // Recover handles create_if_missing, error_if_exists
  bool save_manifest = false;
  Status s = impl->Recover(&edit, &save_manifest);
  if (s.ok() && impl->mem_ == nullptr) {
    // Create new log and a corresponding memtable.
    uint64_t new_log_number = impl->versions_->NewFileNumber();
    WritableFile* lfile;
    s = options.env->NewWritableFile(LogFileName(dbname, new_log_number),
                                     &lfile);
    if (s.ok()) {
      edit.SetLogNumber(new_log_number);
      impl->logfile_ = lfile;
      impl->logfile_number_ = new_log_number;
      impl->log_ = new log::Writer(lfile);
      impl->mem_ = new MemTable(impl->internal_comparator_);
      impl->mem_->Ref();
    }
  }
  if (s.ok() && save_manifest) {
    edit.SetPrevLogNumber(0);  // No older logs needed after recovery.
    edit.SetLogNumber(impl->logfile_number_);
    s = impl->versions_->LogAndApply(&edit, &impl->mutex_);
  }
  if (s.ok()) {
    impl->DeleteObsoleteFiles();
    impl->MaybeScheduleCompaction();
  }
  impl->mutex_.Unlock();
  if (s.ok()) {
    assert(impl->mem_ != nullptr);
    *dbptr = impl;
  } else {
    delete impl;
  }
  return s;
}